

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void parsecopyright(rnndb *db,char *file,xmlNode *node)

{
  uint uVar1;
  int iVar2;
  uint64_t uVar3;
  char *pcVar4;
  undefined8 *puVar5;
  char *pcVar6;
  void *pvVar7;
  long in_RDX;
  undefined8 in_RSI;
  uint *in_RDI;
  char *nickname;
  xmlAttr *nickattr;
  xmlNode *authorchild;
  xmlAttr *authorattr;
  rnnauthor *author;
  xmlNode *chain;
  uint firstyear;
  xmlAttr *attr;
  rnncopyright *copyright;
  xmlAttr *in_stack_ffffffffffffffa0;
  xmlAttr *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  rnndb *prVar8;
  rnndb *in_stack_ffffffffffffffc0;
  long local_38;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  long local_28;
  
  for (local_28 = *(long *)(in_RDX + 0x58); local_28 != 0; local_28 = *(long *)(local_28 + 0x30)) {
    iVar2 = strcmp(*(char **)(local_28 + 0x10),"year");
    if (iVar2 == 0) {
      uVar3 = getnumattrib(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                           (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),in_stack_ffffffffffffffa8
                          );
      in_stack_ffffffffffffffd4 = (uint)uVar3;
      if ((*in_RDI == 0) || (in_stack_ffffffffffffffd4 < *in_RDI)) {
        *in_RDI = in_stack_ffffffffffffffd4;
      }
    }
    else {
      fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for copyright\n",in_RSI,
              (ulong)*(ushort *)(in_RDX + 0x70),*(undefined8 *)(local_28 + 0x10));
      in_RDI[0x20] = 1;
    }
  }
  local_38 = *(long *)(in_RDX + 0x18);
  do {
    if (local_38 == 0) {
      return;
    }
    if (*(int *)(local_38 + 8) == 1) {
      iVar2 = strcmp(*(char **)(local_38 + 0x10),"license");
      if (iVar2 == 0) {
        if (*(long *)(in_RDI + 2) == 0) {
          pcVar4 = getcontent((xmlNode *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
          *(char **)(in_RDI + 2) = pcVar4;
        }
        else {
          iVar2 = strcmp(*(char **)(in_RDI + 2),*(char **)(in_RDX + 0x50));
          if (iVar2 != 0) {
            fprintf(_stderr,"fatal error: multiple different licenses specified!\n");
            abort();
          }
        }
      }
      else {
        iVar2 = strcmp(*(char **)(local_38 + 0x10),"author");
        if (iVar2 == 0) {
          puVar5 = (undefined8 *)calloc(0x30,1);
          prVar8 = *(rnndb **)(local_38 + 0x58);
          pcVar4 = *(char **)(local_38 + 0x18);
          pcVar6 = getcontent((xmlNode *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
          puVar5[2] = pcVar6;
          for (; prVar8 != (rnndb *)0x0; prVar8 = (rnndb *)prVar8->bitsets) {
            iVar2 = strcmp((char *)(prVar8->copyright).authors,"name");
            if (iVar2 == 0) {
              pcVar6 = getattrib(prVar8,pcVar4,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                                 in_stack_ffffffffffffffa0);
              pcVar6 = strdup(pcVar6);
              *puVar5 = pcVar6;
            }
            else {
              iVar2 = strcmp((char *)(prVar8->copyright).authors,"email");
              if (iVar2 == 0) {
                pcVar6 = getattrib(prVar8,pcVar4,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                                   in_stack_ffffffffffffffa0);
                pcVar6 = strdup(pcVar6);
                puVar5[1] = pcVar6;
              }
              else {
                fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for author\n",in_RSI,
                        (ulong)*(ushort *)(local_38 + 0x70),(prVar8->copyright).authors);
                in_RDI[0x20] = 1;
              }
            }
          }
          prVar8 = (rnndb *)0x0;
          for (; pcVar4 != (char *)0x0; pcVar4 = *(char **)(pcVar4 + 0x30)) {
            if (*(int *)(pcVar4 + 8) == 1) {
              iVar2 = strcmp(*(char **)(pcVar4 + 0x10),"nick");
              if (iVar2 == 0) {
                in_stack_ffffffffffffffa0 = (xmlAttr *)0x0;
                for (in_stack_ffffffffffffffa8 = *(xmlAttr **)(pcVar4 + 0x58);
                    in_stack_ffffffffffffffa8 != (xmlAttr *)0x0;
                    in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffa8->next) {
                  iVar2 = strcmp((char *)in_stack_ffffffffffffffa8->name,"name");
                  if (iVar2 == 0) {
                    pcVar6 = getattrib(prVar8,pcVar4,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20)
                                       ,in_stack_ffffffffffffffa0);
                    in_stack_ffffffffffffffa0 = (xmlAttr *)strdup(pcVar6);
                  }
                  else {
                    fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for nick\n",in_RSI,
                            (ulong)*(ushort *)(pcVar4 + 0x70),in_stack_ffffffffffffffa8->name);
                    in_RDI[0x20] = 1;
                  }
                }
                if (in_stack_ffffffffffffffa0 == (xmlAttr *)0x0) {
                  fprintf(_stderr,"%s:%d: missing \"name\" attribute for nick\n",in_RSI,
                          (ulong)*(ushort *)(pcVar4 + 0x70));
                  in_RDI[0x20] = 1;
                }
                else {
                  if (*(int *)((long)puVar5 + 0x2c) <= *(int *)(puVar5 + 5)) {
                    if (*(int *)((long)puVar5 + 0x2c) == 0) {
                      *(undefined4 *)((long)puVar5 + 0x2c) = 0x10;
                    }
                    else {
                      *(int *)((long)puVar5 + 0x2c) = *(int *)((long)puVar5 + 0x2c) << 1;
                    }
                    pvVar7 = realloc((void *)puVar5[4],(long)*(int *)((long)puVar5 + 0x2c) << 3);
                    puVar5[4] = pvVar7;
                  }
                  iVar2 = *(int *)(puVar5 + 5);
                  *(int *)(puVar5 + 5) = iVar2 + 1;
                  *(xmlAttr **)(puVar5[4] + (long)iVar2 * 8) = in_stack_ffffffffffffffa0;
                }
              }
              else {
                fprintf(_stderr,"%s:%d: wrong tag in author: <%s>\n",in_RSI,
                        (ulong)*(ushort *)(pcVar4 + 0x70),*(undefined8 *)(pcVar4 + 0x10));
                in_RDI[0x20] = 1;
              }
            }
          }
          if ((int)in_RDI[7] <= (int)in_RDI[6]) {
            if (in_RDI[7] == 0) {
              in_RDI[7] = 0x10;
            }
            else {
              in_RDI[7] = in_RDI[7] << 1;
            }
            pvVar7 = realloc(*(void **)(in_RDI + 4),(long)(int)in_RDI[7] << 3);
            *(void **)(in_RDI + 4) = pvVar7;
          }
          uVar1 = in_RDI[6];
          in_RDI[6] = uVar1 + 1;
          *(undefined8 **)(*(long *)(in_RDI + 4) + (long)(int)uVar1 * 8) = puVar5;
        }
        else {
          fprintf(_stderr,"%s:%d: wrong tag in copyright: <%s>\n",in_RSI,
                  (ulong)*(ushort *)(local_38 + 0x70),*(undefined8 *)(local_38 + 0x10));
          in_RDI[0x20] = 1;
        }
      }
    }
    local_38 = *(long *)(local_38 + 0x30);
  } while( true );
}

Assistant:

static void parsecopyright(struct rnndb *db, char *file, xmlNode *node) {
	struct rnncopyright* copyright = &db->copyright;
	xmlAttr *attr = node->properties;
	while (attr) {
		if (!strcmp(attr->name, "year")) {
			unsigned firstyear = getnumattrib(db, file, node->line, attr);
			if(!copyright->firstyear || firstyear < copyright->firstyear)
				copyright->firstyear = firstyear;
		} else {
			fprintf (stderr, "%s:%d: wrong attribute \"%s\" for copyright\n", file, node->line, attr->name);
			db->estatus = 1;
		}
		attr = attr->next;
	}
	xmlNode *chain = node->children;
	while (chain) {
		if (chain->type != XML_ELEMENT_NODE) {
		} else if (!strcmp(chain->name, "license"))
			if(copyright->license) {
				if(strcmp(copyright->license, node->content)) {
					fprintf(stderr, "fatal error: multiple different licenses specified!\n");
					abort(); /* TODO: do something better here, but headergen, xml2html, etc. should not produce anything in this case */
				}
			} else
				copyright->license = getcontent(chain);
		else if (!strcmp(chain->name, "author")) {
			struct rnnauthor* author = calloc(sizeof *author, 1);
			xmlAttr* authorattr = chain->properties;
			xmlNode *authorchild = chain->children;
			author->contributions = getcontent(chain);
			while (authorattr) {
				if (!strcmp(authorattr->name, "name"))
					author->name = strdup(getattrib(db, file, chain->line, authorattr));
				else if (!strcmp(authorattr->name, "email"))
					author->email = strdup(getattrib(db, file, chain->line, authorattr));
				else {
					fprintf (stderr, "%s:%d: wrong attribute \"%s\" for author\n", file, chain->line, authorattr->name);
					db->estatus = 1;
				}
				authorattr = authorattr->next;
			}
			while(authorchild)  {
				if (authorchild->type != XML_ELEMENT_NODE) {
				} else if (!strcmp(authorchild->name, "nick")) {
					xmlAttr* nickattr = authorchild->properties;
					char* nickname = 0;
					while(nickattr) {
						if (!strcmp(nickattr->name, "name"))
							nickname = strdup(getattrib(db, file, authorchild->line, nickattr));
						else {
							fprintf (stderr, "%s:%d: wrong attribute \"%s\" for nick\n", file, authorchild->line, nickattr->name);
							db->estatus = 1;
						}
						nickattr = nickattr->next;
					}
					if(!nickname) {
						fprintf (stderr, "%s:%d: missing \"name\" attribute for nick\n", file, authorchild->line);
						db->estatus = 1;
					} else
						ADDARRAY(author->nicknames, nickname);
				} else {
					fprintf (stderr, "%s:%d: wrong tag in author: <%s>\n", file, authorchild->line, authorchild->name);
					db->estatus = 1;
				}
				authorchild = authorchild->next;
			}
			ADDARRAY(copyright->authors, author);
		} else {
			fprintf (stderr, "%s:%d: wrong tag in copyright: <%s>\n", file, chain->line, chain->name);
			db->estatus = 1;
		}
		chain = chain->next;
	}
}